

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeViewPrivate::itemHeight(QTreeViewPrivate *this,int item)

{
  QTreeViewItem *pQVar1;
  int iVar2;
  uint uVar3;
  pointer pQVar4;
  ulong uVar5;
  
  if (this->uniformRowHeights == true) {
    iVar2 = this->defaultItemHeight;
  }
  else {
    iVar2 = 0;
    if ((this->viewItems).d.size != 0) {
      pQVar1 = (this->viewItems).d.ptr;
      if (((-1 < pQVar1[item].index.r) && (-1 < pQVar1[item].index.c)) &&
         (pQVar1 = pQVar1 + item, (pQVar1->index).m.ptr != (QAbstractItemModel *)0x0)) {
        uVar5 = (ulong)*(short *)&pQVar1->field_0x22;
        if ((long)uVar5 < 1) {
          uVar3 = QTreeView::indexRowSizeHint
                            (*(QTreeView **)
                              &(this->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8,&pQVar1->index);
          uVar5 = (ulong)uVar3;
          pQVar4 = QList<QTreeViewItem>::data(&this->viewItems);
          *(short *)&pQVar4[item].field_0x22 = (short)uVar3;
        }
        iVar2 = 0;
        if (0 < (int)uVar5) {
          iVar2 = (int)uVar5;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int QTreeViewPrivate::itemHeight(int item) const
{
    Q_ASSERT(item < viewItems.size());
    if (uniformRowHeights)
        return defaultItemHeight;
    if (viewItems.isEmpty())
        return 0;
    const QModelIndex &index = viewItems.at(item).index;
    if (!index.isValid())
        return 0;
    int height = viewItems.at(item).height;
    if (height <= 0) {
        height = q_func()->indexRowSizeHint(index);
        viewItems[item].height = height;
    }
    return qMax(height, 0);
}